

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::createBlockBasicTypeCases
               (TestCaseGroup *group,Context *context,char *name,VarType *type,deUint32 layoutFlags,
               int numInstances)

{
  TestNode *pTVar1;
  long *plVar2;
  long *plVar3;
  int in_stack_ffffffffffffff78;
  allocator<char> local_81;
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  TestNode *local_40;
  VarType *local_38;
  
  local_40 = &group->super_TestNode;
  local_38 = type;
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,name,&local_81);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,(Context *)context->m_testCtx,(char *)context->m_renderCtx
             ,(char *)local_60,local_38,layoutFlags | 0x100,in_stack_ffffffffffffff78);
  tcu::TestNode::addChild(local_40,pTVar1);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,name,&local_81);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,(Context *)context->m_testCtx,(char *)context->m_renderCtx
             ,(char *)local_60,local_38,layoutFlags | 0x200,in_stack_ffffffffffffff78);
  tcu::TestNode::addChild(local_40,pTVar1);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if ((layoutFlags & 0x10) == 0) {
    pTVar1 = (TestNode *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,name,&local_81);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    BlockBasicTypeCase::BlockBasicTypeCase
              ((BlockBasicTypeCase *)pTVar1,(Context *)context->m_testCtx,
               (char *)context->m_renderCtx,(char *)local_60,local_38,layoutFlags | 0x300,
               in_stack_ffffffffffffff78);
    tcu::TestNode::addChild(local_40,pTVar1);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
  }
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, Context& context, const char* name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_vertex").c_str(),		"", type, layoutFlags|DECLARE_VERTEX,					numInstances));
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_fragment").c_str(),	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances));

	if (!(layoutFlags & LAYOUT_PACKED))
		group->addChild(new BlockBasicTypeCase(context, (string(name) + "_both").c_str(),	"", type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances));
}